

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_stor_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  byte *pbVar1;
  connectdata *pcVar2;
  curl_trc_feat *pcVar3;
  CURLcode CVar4;
  undefined8 in_RAX;
  _Bool connected;
  _Bool local_11;
  
  local_11 = SUB81((ulong)in_RAX >> 0x38,0);
  if (ftpcode < 400) {
    pcVar2 = data->conn;
    (pcVar2->proto).ftpc.state_saved = instate;
    if (((data->set).field_0x8cb & 0x10) == 0) {
      CVar4 = InitiateTransfer(data);
      return CVar4;
    }
    _ftp_state(data,'\0');
    CVar4 = AllowServerConnect(data,&local_11);
    if (CVar4 == CURLE_OK) {
      if (local_11 == false) {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))
           )) {
          Curl_infof(data,"Data conn was not available immediately");
        }
        pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
        *pbVar1 = *pbVar1 | 0x20;
      }
      CVar4 = CURLE_OK;
    }
  }
  else {
    Curl_failf(data,"Failed FTP upload: %0d",(ulong)(uint)ftpcode);
    _ftp_state(data,'\0');
    CVar4 = CURLE_UPLOAD_FAILED;
  }
  return CVar4;
}

Assistant:

static CURLcode ftp_state_stor_resp(struct Curl_easy *data,
                                    int ftpcode, ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  if(ftpcode >= 400) {
    failf(data, "Failed FTP upload: %0d", ftpcode);
    ftp_state(data, FTP_STOP);
    /* oops, we never close the sockets! */
    return CURLE_UPLOAD_FAILED;
  }

  conn->proto.ftpc.state_saved = instate;

  /* PORT means we are now awaiting the server to connect to us. */
  if(data->set.ftp_use_port) {
    bool connected;

    ftp_state(data, FTP_STOP); /* no longer in STOR state */

    result = AllowServerConnect(data, &connected);
    if(result)
      return result;

    if(!connected) {
      struct ftp_conn *ftpc = &conn->proto.ftpc;
      infof(data, "Data conn was not available immediately");
      ftpc->wait_data_conn = TRUE;
    }

    return CURLE_OK;
  }
  return InitiateTransfer(data);
}